

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

void __thiscall
amrex::PODVector<int,_std::allocator<int>_>::resize
          (PODVector<int,_std::allocator<int>_> *this,size_type a_new_size,int *a_val)

{
  PODVector<int,_std::allocator<int>_> *this_00;
  PODVector<int,_std::allocator<int>_> *in_RSI;
  PODVector<int,_std::allocator<int>_> *in_RDI;
  size_type old_size;
  allocator<int> *in_stack_ffffffffffffffc8;
  int *value;
  
  this_00 = (PODVector<int,_std::allocator<int>_> *)size(in_RDI);
  resize(this_00,(size_type)in_RDI);
  if (this_00 < in_RSI) {
    value = in_RDI->m_data + (long)this_00;
    size(in_RDI);
    detail::uninitializedFillNImpl<std::allocator<int>,int,unsigned_long,int>
              ((int *)this_00,(unsigned_long)in_RDI,value,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void resize (size_type a_new_size, const T& a_val) noexcept
        {
            size_type old_size = size();
            resize(a_new_size);
            if (old_size < a_new_size)
            {
                detail::uninitializedFillNImpl<Allocator>(m_data + old_size,
                                                          size() - old_size,
                                                          a_val, *this);
            }
        }